

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O1

BuildValue * __thiscall
anon_unknown.dwarf_6d54c::StaleFileRemovalCommand::getResultForOutput
          (BuildValue *__return_storage_ptr__,StaleFileRemovalCommand *this,Node *node,
          BuildValue *value)

{
  ValueType local_40;
  BinaryDecoder local_28;
  
  if (value->kind - FailedCommand < 3) {
    __return_storage_ptr__->kind = FailedInput;
  }
  else {
    if (value->kind != SkippedCommand) {
      llbuild::buildsystem::BuildValue::toData(&local_40,value);
      local_28.data.Length =
           (long)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
      local_28.data.Data =
           (char *)local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start;
      local_28.pos = 0;
      llbuild::buildsystem::BuildValue::BuildValue(__return_storage_ptr__,&local_28);
      if (local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete(local_40.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_40.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->kind = SkippedCommand;
  }
  *(undefined8 *)&__return_storage_ptr__->numOutputInfos = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->signature).value + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.device + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.inode + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.mode + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.size + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.modTime.seconds + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.modTime.nanoseconds + 4) =
       0;
  *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x34) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x3c) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x44) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x4c) = 0;
  (__return_storage_ptr__->stringValues).contents = (char *)0x0;
  (__return_storage_ptr__->stringValues).size = 0;
  return __return_storage_ptr__;
}

Assistant:

virtual BuildValue getResultForOutput(Node* node,
                                        const BuildValue& value) override {
    // If the value was a failed command, propagate the failure.
    if (value.isFailedCommand() || value.isPropagatedFailureCommand() ||
        value.isCancelledCommand())
      return BuildValue::makeFailedInput();
    if (value.isSkippedCommand())
      return BuildValue::makeSkippedCommand();

    // Otherwise, this was successful, return the value as-is.
    return BuildValue::fromData(value.toData());;
  }